

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNRand.cpp
# Opt level: O2

void __thiscall NaPNRandomGen::set_uniform_distrib(NaPNRandomGen *this,NaReal *fMin,NaReal *fMax)

{
  uint uVar1;
  undefined4 *puVar2;
  NaUnit *pNVar3;
  uint i;
  ulong uVar4;
  
  NaPetriNode::check_tunable((NaPetriNode *)this);
  if (((fMax != (NaReal *)0x0) && (fMin != (NaReal *)0x0)) &&
     (pNVar3 = (this->super_NaPNGenerator).pUnit, pNVar3 != (NaUnit *)0x0)) {
    uVar4 = 0;
    while( true ) {
      uVar1 = (*(pNVar3->super_NaLogging)._vptr_NaLogging[9])();
      if (uVar1 <= uVar4) break;
      NaRandomSequence::SetDistribution(this->pRandGen,rdUniform,(uint)uVar4);
      NaRandomSequence::SetUniformParams(this->pRandGen,fMin[uVar4],fMax[uVar4],(uint)uVar4);
      uVar4 = uVar4 + 1;
      pNVar3 = (this->super_NaPNGenerator).pUnit;
    }
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

void
NaPNRandomGen::set_uniform_distrib (const NaReal* fMin, const NaReal* fMax)
{
  check_tunable();

  if(NULL == pUnit || NULL == fMin || NULL == fMax)
    throw(na_null_pointer);

  // Setup distribution parameters
  for(unsigned i = 0; i < pUnit->InputDim(); ++i)
    {
      pRandGen->SetDistribution(rdUniform, i);
      pRandGen->SetUniformParams(fMin[i], fMax[i], i);
    }
}